

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::setDownloadBuffer
          (QNetworkReplyImplPrivate *this,QSharedPointer<char> *sp,qint64 size)

{
  QNetworkReplyImpl *pQVar1;
  char *pcVar2;
  qint64 in_RDX;
  QSharedPointer<char> *in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImpl *q;
  QSharedPointer<char> *this_00;
  QVariant local_28;
  long local_8;
  Attribute code;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  code = (Attribute)((ulong)pQVar1 >> 0x20);
  this_00 = &in_RDI->downloadBufferPointer;
  QSharedPointer<char>::operator=(this_00,in_RSI);
  pcVar2 = QSharedPointer<char>::data((QSharedPointer<char> *)0x1ec123);
  in_RDI->downloadBuffer = pcVar2;
  in_RDI->downloadBufferCurrentSize = 0;
  in_RDI->downloadBufferMaximumSize = in_RDX;
  QVariant::fromValue<QSharedPointer<char>>(this_00);
  QNetworkReply::setAttribute((QNetworkReply *)in_RDI,code,(QVariant *)this_00);
  QVariant::~QVariant(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::setDownloadBuffer(QSharedPointer<char> sp, qint64 size)
{
    Q_Q(QNetworkReplyImpl);

    downloadBufferPointer = sp;
    downloadBuffer = downloadBufferPointer.data();
    downloadBufferCurrentSize = 0;
    downloadBufferMaximumSize = size;
    q->setAttribute(QNetworkRequest::DownloadBufferAttribute, QVariant::fromValue<QSharedPointer<char> > (downloadBufferPointer));
}